

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O0

void Saig_ManExplorePaths_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int f,int fMax,Vec_Ptr_t *vSimInfo)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int local_30;
  int iPiNum;
  int i;
  int Value;
  Vec_Ptr_t *vSimInfo_local;
  int fMax_local;
  int f_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Saig_ManSimInfo2Get(vSimInfo,pObj,f);
  iVar2 = Saig_ManSimInfo2IsOld(iVar1);
  if (iVar2 == 0) {
    Saig_ManSetAndDriveImplications_rec(p,pObj,f,fMax,vSimInfo);
    iVar2 = Aig_ObjIsConst1(pObj);
    if (iVar2 != 0) {
      __assert_fail("!Aig_ObjIsConst1(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                    ,0x153,
                    "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)"
                   );
    }
    iVar2 = Saig_ObjIsLo(p,pObj);
    if ((iVar2 == 0) || (f != 0)) {
      iVar2 = Saig_ObjIsPi(p,pObj);
      if (iVar2 == 0) {
        iVar2 = Saig_ObjIsLo(p,pObj);
        if (iVar2 == 0) {
          iVar2 = Aig_ObjIsCo(pObj);
          if (iVar2 == 0) {
            iVar2 = Aig_ObjIsNode(pObj);
            if (iVar2 == 0) {
              __assert_fail("Aig_ObjIsNode(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                            ,0x16a,
                            "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)"
                           );
            }
            if (iVar1 == 2) {
              pAVar3 = Aig_ObjFanin0(pObj);
              Saig_ManExplorePaths_rec(p,pAVar3,f,fMax,vSimInfo);
            }
            else {
              pAVar3 = Aig_ObjFanin0(pObj);
              Saig_ManExplorePaths_rec(p,pAVar3,f,fMax,vSimInfo);
              pAVar3 = Aig_ObjFanin1(pObj);
              Saig_ManExplorePaths_rec(p,pAVar3,f,fMax,vSimInfo);
            }
          }
          else {
            pAVar3 = Aig_ObjFanin0(pObj);
            Saig_ManExplorePaths_rec(p,pAVar3,f,fMax,vSimInfo);
          }
        }
        else {
          if (f < 1) {
            __assert_fail("f > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                          ,0x161,
                          "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)"
                         );
          }
          pAVar3 = Saig_ObjLoToLi(p,pObj);
          Saig_ManExplorePaths_rec(p,pAVar3,f + -1,fMax,vSimInfo);
        }
      }
      else {
        iVar1 = Aig_ObjCioId(pObj);
        for (local_30 = fMax; -1 < local_30; local_30 = local_30 + -1) {
          if (local_30 != f) {
            pAVar3 = Aig_ManCi(p,iVar1);
            Saig_ManSetAndDriveImplications_rec(p,pAVar3,local_30,fMax,vSimInfo);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Saig_ManExplorePaths_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int f, int fMax, Vec_Ptr_t * vSimInfo )
{
    int Value = Saig_ManSimInfo2Get( vSimInfo, pObj, f );
    if ( Saig_ManSimInfo2IsOld( Value ) )
        return;
    Saig_ManSetAndDriveImplications_rec( p, pObj, f, fMax, vSimInfo );
    assert( !Aig_ObjIsConst1(pObj) );
    if ( Saig_ObjIsLo(p, pObj) && f == 0 )
        return;
    if ( Saig_ObjIsPi(p, pObj) )
    {
        // propagate implications of this assignment
        int i, iPiNum = Aig_ObjCioId(pObj);
        for ( i = fMax; i >= 0; i-- )
            if ( i != f )
                Saig_ManSetAndDriveImplications_rec( p, Aig_ManCi(p, iPiNum), i, fMax, vSimInfo );
        return;
    }
    if ( Saig_ObjIsLo( p, pObj ) )
    {
        assert( f > 0 );
        Saig_ManExplorePaths_rec( p, Saig_ObjLoToLi(p, pObj), f-1, fMax, vSimInfo );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( Value == SAIG_ZER_OLD )
    {
//        if ( (Aig_ObjId(pObj) & 1) == 0 )
            Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
//        else
//            Saig_ManExplorePaths_rec( p, Aig_ObjFanin1(pObj), f, fMax, vSimInfo );
    }
    else
    {
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin1(pObj), f, fMax, vSimInfo );
    }
}